

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

char * despot::util::tinyxml::TiXmlBase::ReadText
                 (char *p,TiXmlString *text,bool trimWhiteSpace,char *endTag,bool caseInsensitive,
                 TiXmlEncoding encoding)

{
  char c;
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  undefined7 in_register_00000011;
  char cArr [4];
  int len;
  TiXmlString *local_38;
  
  local_38 = text;
  TiXmlString::operator=(text,"");
  if (((int)CONCAT71(in_register_00000011,trimWhiteSpace) != 0) && (condenseWhiteSpace != '\0')) {
    p = SkipWhiteSpace(p,encoding);
    do {
      bVar2 = false;
      while( true ) {
        if (p == (char *)0x0) {
          return (char *)0x0;
        }
        if ((*p == '\0') || (bVar1 = StringEqual(p,endTag,caseInsensitive,encoding), bVar1))
        goto LAB_00179f79;
        c = *p;
        if ((c != '\r') && ((c != '\n' && (bVar1 = IsWhiteSpace(c), !bVar1)))) break;
        p = p + 1;
        bVar2 = true;
      }
      if (bVar2) {
        TiXmlString::operator+=(local_38,' ');
      }
      cArr[0] = '\0';
      cArr[1] = '\0';
      cArr[2] = '\0';
      cArr[3] = '\0';
      p = GetChar(p,cArr,&len,encoding);
      if ((long)len == 1) {
        TiXmlString::operator+=(local_38,cArr[0]);
      }
      else {
        TiXmlString::append(local_38,cArr,(long)len);
      }
    } while( true );
  }
  while( true ) {
    if (p == (char *)0x0) {
      return (char *)0x0;
    }
    if ((*p == '\0') || (bVar2 = StringEqual(p,endTag,caseInsensitive,encoding), bVar2)) break;
    cArr[0] = '\0';
    cArr[1] = '\0';
    cArr[2] = '\0';
    cArr[3] = '\0';
    p = GetChar(p,cArr,&len,encoding);
    TiXmlString::append(local_38,cArr,(long)len);
  }
LAB_00179f79:
  sVar3 = strlen(endTag);
  return p + sVar3;
}

Assistant:

const char* TiXmlBase::ReadText(const char* p, TIXML_STRING * text,
	bool trimWhiteSpace, const char* endTag, bool caseInsensitive,
	TiXmlEncoding encoding) {
	*text = "";
	if (!trimWhiteSpace // certain tags always keep whitespace
	|| !condenseWhiteSpace) // if true, whitespace is always kept
		{
		// Keep all the white space.
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			int len;
			char cArr[4] = { 0, 0, 0, 0 };
			p = GetChar(p, cArr, &len, encoding);
			text->append(cArr, len);
		}
	} else {
		bool whitespace = false;

		// Remove leading white space:
		p = SkipWhiteSpace(p, encoding);
		while (p && *p && !StringEqual(p, endTag, caseInsensitive, encoding)) {
			if (*p == '\r' || *p == '\n') {
				whitespace = true;
				++p;
			} else if (IsWhiteSpace(*p)) {
				whitespace = true;
				++p;
			} else {
				// If we've found whitespace, add it before the
				// new character. Any whitespace just becomes a space.
				if (whitespace) {
					(*text) += ' ';
					whitespace = false;
				}
				int len;
				char cArr[4] = { 0, 0, 0, 0 };
				p = GetChar(p, cArr, &len, encoding);
				if (len == 1)
					(*text) += cArr[0]; // more efficient
				else
					text->append(cArr, len);
			}
		}
	}
	if (p)
		p += strlen(endTag);
	return p;
}